

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  ConditionalPathDeclarationSyntax *pCVar1;
  Token TVar2;
  Token *unaff_retaddr;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_00000008;
  BumpAllocator *in_stack_00000010;
  PathDeclarationSyntax *in_stack_00000020;
  BumpAllocator *in_stack_00000048;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_00000050;
  BumpAllocator *in_stack_000000e8;
  Token *in_stack_000000f0;
  BumpAllocator *in_stack_ffffffffffffff98;
  PathDeclarationSyntax *in_stack_ffffffffffffffa0;
  Token *args_4;
  
  deepClone<slang::syntax::AttributeInstanceSyntax>(in_stack_00000050,in_stack_00000048);
  TVar2 = parsing::Token::deepClone(in_stack_000000f0,in_stack_000000e8);
  args_4 = (Token *)TVar2.info;
  parsing::Token::deepClone(in_stack_000000f0,in_stack_000000e8);
  not_null<slang::syntax::ExpressionSyntax_*>::operator*
            ((not_null<slang::syntax::ExpressionSyntax_*> *)0x7b2a68);
  deepClone<slang::syntax::ExpressionSyntax>
            ((ExpressionSyntax *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  parsing::Token::deepClone(in_stack_000000f0,in_stack_000000e8);
  not_null<slang::syntax::PathDeclarationSyntax_*>::operator*
            ((not_null<slang::syntax::PathDeclarationSyntax_*> *)0x7b2aa8);
  deepClone<slang::syntax::PathDeclarationSyntax>
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  pCVar1 = BumpAllocator::
           emplace<slang::syntax::ConditionalPathDeclarationSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::parsing::Token,slang::syntax::ExpressionSyntax&,slang::parsing::Token,slang::syntax::PathDeclarationSyntax&>
                     (in_stack_00000010,in_stack_00000008,unaff_retaddr,(Token *)__fn,
                      (ExpressionSyntax *)__child_stack,args_4,in_stack_00000020);
  return (int)pCVar1;
}

Assistant:

static SyntaxNode* clone(const ConditionalPathDeclarationSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<ConditionalPathDeclarationSyntax>(
        *deepClone(node.attributes, alloc),
        node.keyword.deepClone(alloc),
        node.openParen.deepClone(alloc),
        *deepClone<ExpressionSyntax>(*node.predicate, alloc),
        node.closeParen.deepClone(alloc),
        *deepClone<PathDeclarationSyntax>(*node.path, alloc)
    );
}